

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

size_t CVmObjString::copy_latin1_to_string(char *str,size_t len,CVmDataSource *src)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  size_t unaff_R13;
  size_t sVar5;
  char buf [1024];
  byte local_438 [1032];
  
  sVar4 = 0;
  (*src->_vptr_CVmDataSource[8])(src,0,0);
  do {
    iVar2 = (*src->_vptr_CVmDataSource[3])(src,local_438,0x400);
    sVar5 = sVar4;
    if (iVar2 != 0) {
      lVar3 = 0;
      do {
        bVar1 = local_438[lVar3];
        if ((char)bVar1 < '\0') {
          sVar4 = sVar4 + 2;
          if ((byte *)str == (byte *)0x0) goto LAB_0028a562;
          if (sVar4 <= len) {
            *str = bVar1 >> 6 | 0xc0;
            ((byte *)str)[1] = bVar1 & 0xbf;
            str = (char *)((byte *)str + 2);
          }
        }
        else {
          sVar4 = sVar4 + 1;
          if ((byte *)str == (byte *)0x0) {
LAB_0028a562:
            str = (char *)0x0;
          }
          else if (sVar4 <= len) {
            *str = bVar1;
            str = (char *)((byte *)str + 1);
          }
        }
        lVar3 = lVar3 + 1;
        sVar5 = unaff_R13;
      } while (iVar2 != (int)lVar3);
    }
    unaff_R13 = sVar5;
    if (iVar2 == 0) {
      return sVar5;
    }
  } while( true );
}

Assistant:

size_t CVmObjString::copy_latin1_to_string(char *str, size_t len,
                                           CVmDataSource *src)
{
    /* we haven't copied any bytes out yet */
    size_t tot = 0;

    /* seek to the start of the source */
    src->seek(0, OSFSK_SET);

    /* keep going until we reach EOF */
    for (;;)
    {
        /* read the next chunk of bytes from the source */
        char buf[1024];
        int cur = src->readc(buf, sizeof(buf));

        /* if there's nothing left, we're done */
        if (cur == 0)
            return tot;

        /* scan the buffer */
        for (char *p = buf ; cur != 0 ; ++p, --cur)
        {
            /* 
             *   if this character is from 0 to 127, store one byte;
             *   otherwise store it as two bytes in UTF-8 format 
             */
            unsigned char c = *(unsigned char *)p;
            if (c <= 127)
            {
                /* 0..127 -> single byte UTF-8 character */
                tot += 1;
                if (str != 0 && tot <= len)
                    *str++ = c;
            }
            else
            {
                /* 128.255 -> two-byte UTF-8 character */
                tot += 2;
                if (str != 0 && tot <= len)
                {
                    *str++ = (char)(0xC0 | ((c >> 6) & 0x1F));
                    *str++ = (char)(0x80 | (c & 0x3F));
                }
            }
        }
    }
}